

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertScaleKeys
          (FBXConverter *this,aiNodeAnim *na,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *nodes,LayerMap *param_3,int64_t start,int64_t stop,double *maxTime,double *minTime)

{
  undefined1 auVar1 [16];
  vector<long,_std::allocator<long>_> *keys_00;
  KeyFrameListList *inputs_00;
  size_type sVar2;
  ulong uVar3;
  aiVectorKey *paVar4;
  aiVectorKey *local_b8;
  aiVector3t<float> local_90 [2];
  KeyTimeList local_78;
  vector<long,_std::allocator<long>_> *local_60;
  KeyTimeList *keys;
  KeyFrameListList *local_40;
  KeyFrameListList *inputs;
  int64_t stop_local;
  int64_t start_local;
  LayerMap *param_3_local;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *nodes_local;
  aiNodeAnim *na_local;
  FBXConverter *this_local;
  
  inputs = (KeyFrameListList *)stop;
  stop_local = start;
  start_local = (int64_t)param_3;
  param_3_local = (LayerMap *)nodes;
  nodes_local = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                 *)na;
  na_local = (aiNodeAnim *)this;
  sVar2 = std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::size(nodes);
  if (sVar2 != 0) {
    GetKeyframeList((KeyFrameListList *)&keys,this,
                    (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                     *)param_3_local,stop_local,(int64_t)inputs);
    local_40 = (KeyFrameListList *)&keys;
    GetKeyTimeList(&local_78,this,(KeyFrameListList *)&keys);
    local_60 = &local_78;
    sVar2 = std::vector<long,_std::allocator<long>_>::size(local_60);
    *(int *)&nodes_local[0x2c].
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start = (int)sVar2;
    sVar2 = std::vector<long,_std::allocator<long>_>::size(local_60);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    paVar4 = (aiVectorKey *)operator_new__(uVar3);
    if (sVar2 != 0) {
      local_b8 = paVar4;
      do {
        aiVectorKey::aiVectorKey(local_b8);
        local_b8 = local_b8 + 1;
      } while (local_b8 != paVar4 + sVar2);
    }
    nodes_local[0x2c].
    super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar4;
    sVar2 = std::vector<long,_std::allocator<long>_>::size(local_60);
    inputs_00 = local_40;
    keys_00 = local_60;
    if (sVar2 != 0) {
      paVar4 = (aiVectorKey *)
               nodes_local[0x2c].
               super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      aiVector3t<float>::aiVector3t(local_90,1.0,1.0,1.0);
      InterpolateKeys(this,paVar4,keys_00,inputs_00,local_90,maxTime,minTime);
    }
    std::vector<long,_std::allocator<long>_>::~vector(&local_78);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               *)&keys);
    return;
  }
  __assert_fail("nodes.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                ,0xd95,
                "void Assimp::FBX::FBXConverter::ConvertScaleKeys(aiNodeAnim *, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
               );
}

Assistant:

void FBXConverter::ConvertScaleKeys(aiNodeAnim* na, const std::vector<const AnimationCurveNode*>& nodes, const LayerMap& /*layers*/,
            int64_t start, int64_t stop,
            double& maxTime,
            double& minTime)
        {
            ai_assert(nodes.size());

            // XXX for now, assume scale should be blended geometrically (i.e. two
            // layers should be multiplied with each other). There is a FBX
            // property in the layer to specify the behaviour, though.

            const KeyFrameListList& inputs = GetKeyframeList(nodes, start, stop);
            const KeyTimeList& keys = GetKeyTimeList(inputs);

            na->mNumScalingKeys = static_cast<unsigned int>(keys.size());
            na->mScalingKeys = new aiVectorKey[keys.size()];
            if (keys.size() > 0) {
                InterpolateKeys(na->mScalingKeys, keys, inputs, aiVector3D(1.0f, 1.0f, 1.0f), maxTime, minTime);
            }
        }